

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfmcs.cc
# Opt level: O2

InputGraph __thiscall
anon_unknown.dwarf_171c58::read_vfmcs
          (anon_unknown_dwarf_171c58 *this,ifstream *infile,string *filename,bool vertex_labels,
          bool directed)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  GraphFileError *pGVar5;
  int r;
  int iVar6;
  bool bVar7;
  string_view l;
  string_view label;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  uVar1 = read_word(infile);
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
    pGVar5 = (GraphFileError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"error reading size",(allocator<char> *)&local_70);
    GraphFileError::GraphFileError(pGVar5,filename,&local_90,true);
    __cxa_throw(pGVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  InputGraph::InputGraph((InputGraph *)this,uVar1,vertex_labels,false);
  iVar2 = InputGraph::size((InputGraph *)this);
  iVar6 = 1;
  uVar1 = 0;
  uVar3 = 0;
  while( true ) {
    uVar4 = uVar1;
    if (((iVar2 * 0x21) / 100 <= iVar6) || (0xf < uVar3)) break;
    iVar6 = iVar6 * 2;
    uVar1 = uVar4 + 1;
    uVar3 = uVar4;
  }
  iVar6 = 0;
  while( true ) {
    iVar2 = InputGraph::size((InputGraph *)this);
    if (iVar2 <= iVar6) break;
    uVar1 = read_word(infile);
    if (vertex_labels) {
      std::__cxx11::to_string(&local_90,uVar1 >> (0x10 - uVar3 & 0x1f));
      l._M_str = local_90._M_dataplus._M_p;
      l._M_len = local_90._M_string_length;
      InputGraph::set_vertex_label((InputGraph *)this,iVar6,l);
      std::__cxx11::string::~string((string *)&local_90);
    }
    iVar6 = iVar6 + 1;
  }
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) == 0) {
    iVar6 = 0;
    while( true ) {
      iVar2 = InputGraph::size((InputGraph *)this);
      if (iVar2 <= iVar6) {
        std::istream::peek();
        if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 2) != 0) {
          return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                 (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)this;
        }
        pGVar5 = (GraphFileError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"EOF not reached",(allocator<char> *)&local_70);
        GraphFileError::GraphFileError(pGVar5,filename,&local_90,true);
        __cxa_throw(pGVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      uVar1 = read_word(infile);
      if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) break;
      while (bVar7 = uVar1 != 0, uVar1 = uVar1 - 1, bVar7) {
        uVar3 = read_word(infile);
        uVar4 = InputGraph::size((InputGraph *)this);
        if (uVar4 <= uVar3) {
          pGVar5 = (GraphFileError *)__cxa_allocate_exception(0x30);
          std::__cxx11::to_string(&local_50,uVar3);
          std::operator+(&local_70,"edge index ",&local_50);
          std::operator+(&local_90,&local_70," out of bounds");
          GraphFileError::GraphFileError(pGVar5,filename,&local_90,true);
          __cxa_throw(pGVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        if (directed) {
          label._M_str = "directed";
          label._M_len = 8;
          InputGraph::add_directed_edge((InputGraph *)this,iVar6,uVar3,label);
        }
        else {
          InputGraph::add_edge((InputGraph *)this,iVar6,uVar3);
        }
        read_word(infile);
      }
      iVar6 = iVar6 + 1;
    }
    pGVar5 = (GraphFileError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"error reading edges count",(allocator<char> *)&local_70);
    GraphFileError::GraphFileError(pGVar5,filename,&local_90,true);
    __cxa_throw(pGVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  pGVar5 = (GraphFileError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"error reading attributes",(allocator<char> *)&local_70);
  GraphFileError::GraphFileError(pGVar5,filename,&local_90,true);
  __cxa_throw(pGVar5,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto read_vfmcs(ifstream && infile, const string & filename, bool vertex_labels, bool directed) -> InputGraph
    {
        int size = read_word(infile);
        if (! infile)
            throw GraphFileError{filename, "error reading size", true};

        InputGraph result{size, vertex_labels, false};

        // to be like the CP 2011 labelling scheme...
        int m = result.size() * 33 / 100;
        int p = 1, k1 = 0, k2 = 0;
        while (p < m && k1 < 16) {
            p *= 2;
            k1 = k2;
            k2++;
        }

        for (int r = 0; r < result.size(); ++r) {
            unsigned l = read_word(infile) >> (16 - k1);
            if (vertex_labels)
                result.set_vertex_label(r, to_string(l));
        }

        if (! infile)
            throw GraphFileError{filename, "error reading attributes", true};

        for (int r = 0; r < result.size(); ++r) {
            int c_end = read_word(infile);
            if (! infile)
                throw GraphFileError{filename, "error reading edges count", true};

            for (int c = 0; c < c_end; ++c) {
                unsigned e = read_word(infile);

                if (e >= unsigned(result.size()))
                    throw GraphFileError{filename, "edge index " + to_string(e) + " out of bounds", true};

                if (directed)
                    result.add_directed_edge(r, e, "directed");
                else
                    result.add_edge(r, e);
                read_word(infile);
            }
        }

        infile.peek();
        if (! infile.eof())
            throw GraphFileError{filename, "EOF not reached", true};

        return result;
    }